

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountLatchZeroCountZeroDuration_Test::TestBody
          (CountdownLatchTest_TestCountLatchZeroCountZeroDuration_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  int local_94;
  undefined8 local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  CountdownLatch latch;
  CountdownLatchTest_TestCountLatchZeroCountZeroDuration_Test *this_local;
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch((CountdownLatch *)&gtest_ar_.message_,0);
  local_94 = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_90,&local_94);
  bVar1 = bidfx_public_api::tools::CountdownLatch::Await(&gtest_ar_.message_,local_90);
  local_81 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_80,
               (AssertionResult *)"latch.Await(std::chrono::milliseconds(0))","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  CountdownLatch::~CountdownLatch((CountdownLatch *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountLatchZeroCountZeroDuration)
{
    CountdownLatch latch = CountdownLatch(0);
    EXPECT_TRUE(latch.Await(std::chrono::milliseconds(0)));
}